

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number.cpp
# Opt level: O0

Variable __thiscall LiteScript::_Type_NUMBER::OUnaryMinus(_Type_NUMBER *this,Variable *obj)

{
  Object *pOVar1;
  Number *this_00;
  Variable *in_RDX;
  uint *extraout_RDX;
  Variable VVar2;
  Number local_2c;
  undefined1 local_21;
  Variable *local_20;
  Variable *obj_local;
  _Type_NUMBER *this_local;
  Variable *res;
  
  local_21 = 0;
  local_20 = in_RDX;
  obj_local = obj;
  this_local = this;
  pOVar1 = Variable::operator->(in_RDX);
  Memory::Create((Memory *)this,(Type *)pOVar1->memory);
  pOVar1 = Variable::operator->(local_20);
  Object::GetData<LiteScript::Number>(pOVar1);
  Number::operator-(&local_2c);
  pOVar1 = Variable::operator->((Variable *)this);
  this_00 = Object::GetData<LiteScript::Number>(pOVar1);
  Number::operator=(this_00,&local_2c);
  VVar2.nb_ref = extraout_RDX;
  VVar2.obj = (Object *)this;
  return VVar2;
}

Assistant:

LiteScript::Variable LiteScript::_Type_NUMBER::OUnaryMinus(const LiteScript::Variable& obj) const {
    Variable res = obj->memory.Create(Type::NUMBER);
    res->GetData<Number>() = -obj->GetData<Number>();
    return res;
}